

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_cepview.c
# Opt level: O3

int read_cep(char *file,float ***cep,int *numframes,int cepsize)

{
  float fVar1;
  float *pfVar2;
  float **ppfVar3;
  int32 iVar4;
  int iVar5;
  FILE *__stream;
  size_t sVar6;
  long lVar7;
  char *fmt;
  ulong uVar8;
  uint uVar9;
  uint local_dc;
  float **local_d8;
  long local_d0;
  long local_c8;
  stat statbuf;
  
  iVar4 = stat_retry(file,&statbuf);
  if (iVar4 < 0) {
    fmt = "Failed to get file size \'%s\'";
    lVar7 = 0xc6;
  }
  else {
    __stream = fopen(file,"rb");
    if (__stream != (FILE *)0x0) {
      sVar6 = fread(&local_dc,4,1,__stream);
      if (sVar6 == 1) {
        lVar7 = (long)(int)(local_dc * 4 + 4);
        uVar9 = local_dc;
        if ((statbuf.st_size == lVar7) ||
           (uVar9 = local_dc >> 0x18 | (local_dc & 0xff0000) >> 8 | (local_dc & 0xff00) << 8 |
                    local_dc << 0x18, statbuf.st_size == (int)(uVar9 * 4 + 4))) {
          if ((int)uVar9 < 1) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx_cepview/main_cepview.c"
                    ,0xe7,"Header size field: %d\n",(ulong)uVar9);
          }
          else {
            iVar5 = (int)uVar9 / cepsize;
            if (iVar5 * cepsize == uVar9) {
              local_c8 = statbuf.st_size;
              local_d0 = lVar7;
              local_d8 = (float **)
                         __ckd_calloc_2d__((long)iVar5,(long)cepsize,4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx_cepview/main_cepview.c"
                                           ,0xf5);
              sVar6 = fread(*local_d8,4,(ulong)uVar9,__stream);
              ppfVar3 = local_d8;
              if (uVar9 == (uint)sVar6) {
                if (local_c8 != local_d0) {
                  pfVar2 = *local_d8;
                  uVar8 = 0;
                  do {
                    fVar1 = pfVar2[uVar8];
                    pfVar2[uVar8] =
                         (float)((uint)fVar1 >> 0x18 | ((uint)fVar1 & 0xff0000) >> 8 |
                                 ((uint)fVar1 & 0xff00) << 8 | (int)fVar1 << 0x18);
                    uVar8 = uVar8 + 1;
                  } while (uVar9 != uVar8);
                }
                fclose(__stream);
                *numframes = iVar5;
                *cep = ppfVar3;
                return 0;
              }
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx_cepview/main_cepview.c"
                      ,0xfa,"Error reading mfc data from the file \'%s\'",file);
            }
            else {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx_cepview/main_cepview.c"
                      ,0xf0,"Header size field: %d; not multiple of %d\n",(ulong)uVar9,
                      (ulong)(uint)cepsize);
            }
          }
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx_cepview/main_cepview.c"
                  ,0xde,"Header size field: %d(%08x); filesize: %d(%08x)\n",(ulong)local_dc,
                  (ulong)local_dc,statbuf.st_size,statbuf.st_size);
        }
      }
      fclose(__stream);
      return -1;
    }
    fmt = "Failed to open \'%s\' for reading";
    lVar7 = 0xcb;
  }
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx_cepview/main_cepview.c"
                 ,lVar7,fmt,file);
  return -1;
}

Assistant:

int
read_cep(char const *file, float ***cep, int *numframes, int cepsize)
{
    FILE *fp;
    int n_float;
    struct stat statbuf;
    int i, n, byterev;
    float32 **mfcbuf;

    if (stat_retry(file, &statbuf) < 0) {
        E_ERROR_SYSTEM("Failed to get file size '%s'", file);
        return IO_ERR;
    }

    if ((fp = fopen(file, "rb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open '%s' for reading", file);
        return IO_ERR;
    }

    /* Read #floats in header */
    if (fread(&n_float, sizeof(int), 1, fp) != 1) {
        fclose(fp);
        return IO_ERR;
    }

    /* Check if n_float matches file size */
    byterev = FALSE;
    if ((int) (n_float * sizeof(float) + 4) != statbuf.st_size) {
        n = n_float;
        SWAP_INT32(&n);

        if ((int) (n * sizeof(float) + 4) != statbuf.st_size) {
    	    E_ERROR("Header size field: %d(%08x); filesize: %d(%08x)\n",
                 n_float, n_float, (int) statbuf.st_size,
                 (int) statbuf.st_size);
            fclose(fp);
            return IO_ERR;
        }

        n_float = n;
        byterev = TRUE;
    }
    if (n_float <= 0) {
        E_ERROR("Header size field: %d\n", n_float);
        fclose(fp);
        return IO_ERR;
    }

    /* n = #frames of input */
    n = n_float / cepsize;
    if (n * cepsize != n_float) {
        E_ERROR("Header size field: %d; not multiple of %d\n",
               n_float, cepsize);
        fclose(fp);
        return IO_ERR;
    }

    mfcbuf = (float **) ckd_calloc_2d(n, cepsize, sizeof(float32));

    /* Read mfc data and byteswap if necessary */
    n_float = n * cepsize;
    if ((int) fread(mfcbuf[0], sizeof(float), n_float, fp) != n_float) {
        E_ERROR("Error reading mfc data from the file '%s'", file);
        fclose(fp);
        return IO_ERR;
    }
    if (byterev) {
        for (i = 0; i < n_float; i++)
            SWAP_FLOAT32(&(mfcbuf[0][i]));
    }
    fclose(fp);

    *numframes = n;
    *cep = mfcbuf;
    return IO_SUCCESS;
}